

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O1

int64_t __thiscall
spvtools::opt::LoopDependenceAnalysis::CountInductionVariables
          (LoopDependenceAnalysis *this,SENode *node)

{
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  recurrent_nodes;
  set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  loops;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_60;
  _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  local_48;
  
  if (node == (SENode *)0x0) {
    local_48._M_impl.super__Rb_tree_header._M_node_count = 0xffffffffffffffff;
  }
  else {
    SENode::CollectRecurrentNodes(&local_60,node);
    CollectLoops((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                  *)&local_48,(LoopDependenceAnalysis *)node,&local_60);
    std::
    _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
    ::_M_erase(&local_48,(_Link_type)local_48._M_impl.super__Rb_tree_header._M_header._M_parent);
    if (local_60.
        super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.
                      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.
                            super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.
                            super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return local_48._M_impl.super__Rb_tree_header._M_node_count;
}

Assistant:

int64_t LoopDependenceAnalysis::CountInductionVariables(SENode* node) {
  if (!node) {
    return -1;
  }

  std::vector<SERecurrentNode*> recurrent_nodes = node->CollectRecurrentNodes();

  // We don't handle loops with more than one induction variable. Therefore we
  // can identify the number of induction variables by collecting all of the
  // loops the collected recurrent nodes belong to.
  std::set<const Loop*> loops = CollectLoops(recurrent_nodes);

  return static_cast<int64_t>(loops.size());
}